

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O2

void __thiscall Assimp::ObjFile::Object::~Object(Object *this)

{
  Object *this_00;
  pointer ppOVar1;
  
  for (ppOVar1 = (this->m_SubObjects).
                 super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppOVar1 !=
      (this->m_SubObjects).
      super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppOVar1 = ppOVar1 + 1) {
    this_00 = *ppOVar1;
    if (this_00 != (Object *)0x0) {
      ~Object(this_00);
    }
    operator_delete(this_00,0x90);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::
  ~_Vector_base(&(this->m_SubObjects).
                 super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
               );
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Object() {
        for ( std::vector<Object*>::iterator it = m_SubObjects.begin(); it != m_SubObjects.end(); ++it) {
            delete *it;
        }
    }